

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bool __thiscall
jsoncons::typed_array_visitor<std::vector<short,_std::allocator<short>_>_>::visit_double
          (typed_array_visitor<std::vector<short,_std::allocator<short>_>_> *this,double value,
          semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  double in_XMM0_Qa;
  value_type_conflict7 *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  
  std::vector<short,_std::allocator<short>_>::push_back
            ((vector<short,_std::allocator<short>_> *)
             CONCAT26((short)(int)in_XMM0_Qa,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }